

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::fixColToZero(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  reference pvVar4;
  int in_EDX;
  undefined8 in_RSI;
  HPresolve *in_RDI;
  HPresolve *unaff_retaddr;
  HighsInt in_stack_0000000c;
  HPresolveAnalysis *in_stack_00000010;
  HighsInt colpos;
  HighsInt colrow;
  HighsInt coliter;
  double in_stack_00000030;
  HighsInt in_stack_0000003c;
  HighsPostsolveStack *in_stack_00000040;
  bool logging_on;
  HighsInt col_00;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar5;
  uint local_3c;
  HighsInt in_stack_ffffffffffffffcc;
  HPresolve *in_stack_ffffffffffffffd0;
  HPresolve *pHVar6;
  
  col_00 = (HighsInt)((ulong)in_RSI >> 0x20);
  bVar2 = (bool)((in_RDI->analysis_).logging_on_ & 1);
  pHVar6 = in_RDI;
  if (bVar2 != false) {
    HPresolveAnalysis::startPresolveRuleLog
              ((HPresolveAnalysis *)unaff_retaddr,(HighsInt)((ulong)in_RDI >> 0x20));
  }
  iVar5 = in_EDX;
  std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->model->col_cost_,(long)in_EDX);
  getColumnVector(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  HighsPostsolveStack::fixedColAtZero<HighsTripletListSlice>
            (in_stack_00000040,in_stack_0000003c,in_stack_00000030,_colrow);
  markColDeleted((HPresolve *)CONCAT44(iVar5,in_stack_ffffffffffffffa0),col_00);
  puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->colhead,(long)in_EDX)
  ;
  local_3c = *puVar3;
  while (local_3c != 0xffffffff) {
    std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Arow,(long)(int)local_3c);
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->Anext,(long)(int)local_3c);
    uVar1 = *puVar3;
    unlink(in_RDI,(char *)(ulong)local_3c);
    reinsertEquation(unaff_retaddr,(HighsInt)((ulong)pHVar6 >> 0x20));
    local_3c = uVar1;
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->col_cost_,(long)in_EDX);
  *pvVar4 = 0.0;
  (in_RDI->analysis_).logging_on_ = bVar2;
  if (bVar2 != false) {
    HPresolveAnalysis::stopPresolveRuleLog(in_stack_00000010,in_stack_0000000c);
  }
  return;
}

Assistant:

void HPresolve::fixColToZero(HighsPostsolveStack& postsolve_stack,
                             HighsInt col) {
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleFixedCol);
  postsolve_stack.fixedColAtZero(col, model->col_cost_[col],
                                 getColumnVector(col));
  // mark the column as deleted first so that it is not registered as singleton
  // column upon removing its nonzeros
  markColDeleted(col);

  for (HighsInt coliter = colhead[col]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    assert(Acol[coliter] == col);

    HighsInt colpos = coliter;
    coliter = Anext[coliter];

    unlink(colpos);

    reinsertEquation(colrow);
  }

  model->col_cost_[col] = 0;
  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleFixedCol);
}